

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O2

void initialize_states(void)

{
  Yshort *pYVar1;
  Yshort *pYVar2;
  core *pcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  pYVar1 = derives[start_symbol];
  uVar7 = 0x1c;
  iVar6 = -1;
  do {
    iVar6 = iVar6 + 1;
    lVar4 = uVar7 - 0x1c;
    uVar7 = uVar7 + 4;
  } while (-1 < *(int *)((long)pYVar1 + lVar4));
  pcVar3 = (core *)malloc(uVar7 & 0xffffffff);
  if (pcVar3 == (core *)0x0) {
    no_space();
  }
  pcVar3->next = (core *)0x0;
  pcVar3->link = (core *)0x0;
  pcVar3->number = 0;
  pcVar3->accessing_symbol = 0;
  pcVar3->nitems = iVar6;
  pYVar2 = rrhs;
  for (lVar4 = 0; lVar5 = (long)*(int *)((long)pYVar1 + lVar4), -1 < lVar5; lVar4 = lVar4 + 4) {
    *(Yshort *)((long)pcVar3->items + lVar4) = pYVar2[lVar5];
  }
  this_state = pcVar3;
  last_state = pcVar3;
  first_state = pcVar3;
  nstates = 1;
  return;
}

Assistant:

void initialize_states()
{
    register int i;
    register Yshort *start_derives;
    register core *p;

    start_derives = derives[start_symbol];
    for (i = 0; start_derives[i] >= 0; ++i)
	continue;

    p = (core *) MALLOC(sizeof(core) + i*sizeof(Yshort));
    if (p == 0) no_space();

    p->next = 0;
    p->link = 0;
    p->number = 0;
    p->accessing_symbol = 0;
    p->nitems = i;

    for (i = 0;  start_derives[i] >= 0; ++i)
	p->items[i] = rrhs[start_derives[i]];

    first_state = last_state = this_state = p;
    nstates = 1;
}